

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

Factor * __thiscall libDAI::MaxPlus::beliefV(Factor *__return_storage_ptr__,MaxPlus *this,size_t i)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Var *n;
  long lVar4;
  long lVar5;
  long *plVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var_03 [56];
  Prob prod;
  allocator_type local_61;
  TProb<double> local_60;
  VarSet local_48;
  undefined1 auVar7 [64];
  
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                    ((long *)CONCAT44(extraout_var,iVar2),i);
  auVar7._8_56_ = extraout_var_03;
  auVar7._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar7._0_16_,*(size_type *)(lVar3 + 8));
  local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(1.0 / auVar1._0_8_);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60._p,*(size_type *)(lVar3 + 8),(value_type_conflict3 *)&local_48,&local_61);
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  plVar6 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x70) + i * 0x18);
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if (plVar6 == *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x70) + 8 + i * 0x18))
    break;
    if ((long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar4 = (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar3 = *(long *)&(this->_newmessages).
                        super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[i].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + *plVar6 * 8)]._p.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar5 = 0;
      do {
        local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] =
             *(double *)(lVar3 + lVar5 * 8) *
             local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    plVar6 = plVar6 + 1;
  }
  TProb<double>::normalize(&local_60,NORMPROB);
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x30))
                       ((long *)CONCAT44(extraout_var_02,iVar2),i);
  VarSet::VarSet(&local_48,n);
  TFactor<double>::TFactor(__return_storage_ptr__,&local_48,&local_60);
  if (local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Factor MaxPlus::beliefV( size_t i ) const {
        Prob prod( grm().var(i).states() ); 
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ ) 
            prod *= newMessage(i,*I);

        prod.normalize();
        return( Factor( grm().var(i), prod ) );
    }